

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QModelIndex *mi)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  undefined8 uVar4;
  Picker *this_00;
  bool bVar5;
  QModelIndex local_68;
  QModelIndex local_48;
  
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  iVar1 = this->modelColumn;
  if (mi->c != iVar1) {
    pQVar3 = this->model;
    iVar2 = mi->r;
    QModelIndex::parent(&local_48,mi);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_68,pQVar3,iVar2,iVar1,&local_48);
    if (((-1 < local_68.r) && (-1 < (long)local_68._0_8_)) &&
       (local_68.m != (QAbstractItemModel *)0x0)) goto LAB_00181403;
  }
  local_68.m = mi->m;
  local_68.r = mi->r;
  local_68.c = mi->c;
  local_68.i = mi->i;
LAB_00181403:
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->currentIndex);
  bVar5 = QModelIndex::operator!=(&local_68,&local_48);
  if (bVar5) {
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_48,&local_68);
    uVar4 = *(undefined8 *)&this->currentIndex;
    *(undefined8 *)&this->currentIndex = local_48._0_8_;
    local_48._0_8_ = uVar4;
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_48);
    QWidget::update();
    this_00 = this->q;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->currentIndex);
    Picker::_q_emitCurrentIndexChanged(this_00,&local_48);
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QModelIndex & mi )
{
	QModelIndex normalized;

	if( mi.column() != modelColumn )
		normalized = model->index( mi.row(), modelColumn, mi.parent() );

	if( !normalized.isValid() )
		normalized = mi;    // Fallback to passed index.

	bool indexChanged = ( normalized != currentIndex );

	if( indexChanged )
	{
		currentIndex = QPersistentModelIndex( normalized );
		q->update();
		q->_q_emitCurrentIndexChanged( currentIndex );
	}
}